

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O2

string * __thiscall
pbrt::ExhaustiveLightSampler::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ExhaustiveLightSampler *this)

{
  vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_> *in_RCX;
  
  StringPrintf<pstd::vector<pbrt::LightBounds,pstd::pmr::polymorphic_allocator<pbrt::LightBounds>>const&>
            (__return_storage_ptr__,(pbrt *)"[ ExhaustiveLightSampler lightBounds: %s]",
             (char *)&this->lightBounds,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string ExhaustiveLightSampler::ToString() const {
    return StringPrintf("[ ExhaustiveLightSampler lightBounds: %s]", lightBounds);
}